

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O3

void ssh2channel_start_command(SshChannel *sc,_Bool want_reply,char *command)

{
  SshChannelVtable *pSVar1;
  PktOut *pPVar2;
  cr_handler_fn_t handler;
  undefined7 in_register_00000031;
  
  pSVar1 = sc[-0xb].vt;
  handler = ssh2_channel_response;
  if ((int)CONCAT71(in_register_00000031,want_reply) == 0) {
    handler = (cr_handler_fn_t)0x0;
  }
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"exec",handler,(void *)0x0);
  BinarySink_put_stringz(pPVar2->binarysink_,command);
  pq_base_push((PacketQueueBase *)pSVar1[1].request_agent_forwarding,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_start_command(
    SshChannel *sc, bool want_reply, const char *command)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(
        c, "exec", want_reply ? ssh2_channel_response : NULL, NULL);
    put_stringz(pktout, command);
    pq_push(s->ppl.out_pq, pktout);
}